

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_wav_init_write__internal
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_uint64 totalSampleCount)

{
  ma_dr_wav_container mVar1;
  int iVar2;
  ma_dr_wav_data_format *pmVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  ma_uint64 mVar14;
  ulong local_58;
  ulong local_50;
  ma_dr_wav_data_format *local_48;
  ma_uint64 local_40;
  ulong local_38;
  
  if (pWav->isSequentialWrite == 0) {
    local_50 = 0;
  }
  else {
    local_50 = (pWav->fmt).bitsPerSample * totalSampleCount;
    if (pFormat->container == ma_dr_wav_container_riff && 0x3ffffff6 < local_50 >> 5) {
      return 0;
    }
    local_50 = local_50 >> 3;
  }
  pWav->dataChunkDataSizeTargetWrite = local_50;
  mVar1 = pFormat->container;
  local_48 = pFormat;
  local_40 = totalSampleCount;
  if (mVar1 == ma_dr_wav_container_rf64) {
    sVar4 = (*pWav->onWrite)(pWav->pUserData,"RF64",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_001539e9:
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar12 = sVar5 + sVar4;
    pvVar11 = pWav->pUserData;
    pcVar10 = "WAVE";
    sVar4 = 4;
  }
  else {
    if (mVar1 != ma_dr_wav_container_w64) {
      if (mVar1 != ma_dr_wav_container_riff) {
        return 0;
      }
      iVar2 = (int)local_50;
      sVar4 = (*pWav->onWrite)(pWav->pUserData,"RIFF",4);
      local_58 = CONCAT44(local_58._4_4_,iVar2 + 0x1c);
      pFormat = local_48;
      goto LAB_001539e9;
    }
    uVar13 = local_50 + 0x68;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_RIFF,0x10);
    local_58 = uVar13;
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    lVar12 = sVar5 + sVar4;
    pvVar11 = pWav->pUserData;
    sVar4 = 0x10;
    pcVar10 = (char *)ma_dr_wavGUID_W64_WAVE;
  }
  sVar4 = (*pWav->onWrite)(pvVar11,pcVar10,sVar4);
  uVar13 = local_50;
  lVar12 = sVar4 + lVar12;
  if (pFormat->container == ma_dr_wav_container_rf64) {
    local_38 = local_50 + 0x24;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,"ds64",4);
    local_58 = CONCAT44(local_58._4_4_,0x1c);
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    local_58 = local_38;
    sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = uVar13;
    sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_40;
    sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_58 & 0xffffffff00000000;
    sVar9 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar12 = sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + lVar12;
    pFormat = local_48;
  }
  mVar1 = pFormat->container;
  if (mVar1 == ma_dr_wav_container_rf64) {
LAB_00153af3:
    sVar4 = (*pWav->onWrite)(pWav->pUserData,"fmt ",4);
    local_58 = CONCAT44(local_58._4_4_,0x10);
    pvVar11 = pWav->pUserData;
    sVar5 = 4;
LAB_00153b46:
    sVar5 = (*pWav->onWrite)(pvVar11,&local_58,sVar5);
    lVar12 = lVar12 + sVar5 + sVar4;
  }
  else {
    if (mVar1 == ma_dr_wav_container_w64) {
      sVar4 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_FMT,0x10);
      local_58 = 0x28;
      pvVar11 = pWav->pUserData;
      sVar5 = 8;
      goto LAB_00153b46;
    }
    if (mVar1 == ma_dr_wav_container_riff) goto LAB_00153af3;
  }
  local_58._0_2_ = (pWav->fmt).formatTag;
  sVar4 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).channels);
  sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58._0_4_ = (pWav->fmt).sampleRate;
  sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58 = CONCAT44(local_58._4_4_,(pWav->fmt).avgBytesPerSec);
  sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58._0_2_ = (pWav->fmt).blockAlign;
  sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).bitsPerSample);
  sVar9 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  pmVar3 = local_48;
  mVar14 = sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + lVar12;
  if ((((pWav->isSequentialWrite == 0) && (pWav->pMetadata != (ma_dr_wav_metadata *)0x0)) &&
      (pWav->metadataCount != 0)) &&
     ((local_48->container == ma_dr_wav_container_rf64 ||
      (local_48->container == ma_dr_wav_container_riff)))) {
    sVar4 = ma_dr_wav__write_or_count_metadata(pWav,pWav->pMetadata,pWav->metadataCount);
    mVar14 = mVar14 + sVar4;
  }
  pWav->dataChunkDataPos = mVar14;
  mVar1 = pmVar3->container;
  if (mVar1 == ma_dr_wav_container_rf64) {
    sVar4 = (*pWav->onWrite)(pWav->pUserData,"data",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_00153ce0:
    pvVar11 = pWav->pUserData;
    sVar5 = 4;
  }
  else {
    if (mVar1 != ma_dr_wav_container_w64) {
      if (mVar1 != ma_dr_wav_container_riff) goto LAB_00153cf2;
      sVar4 = (*pWav->onWrite)(pWav->pUserData,"data",4);
      local_58 = CONCAT44(local_58._4_4_,(int)local_50);
      goto LAB_00153ce0;
    }
    uVar13 = local_50 + 0x18;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_DATA,0x10);
    pvVar11 = pWav->pUserData;
    sVar5 = 8;
    local_58 = uVar13;
  }
  sVar5 = (*pWav->onWrite)(pvVar11,&local_58,sVar5);
  mVar14 = mVar14 + sVar5 + sVar4;
LAB_00153cf2:
  pWav->container = pmVar3->container;
  pWav->channels = (ma_uint16)pmVar3->channels;
  pWav->sampleRate = pmVar3->sampleRate;
  pWav->bitsPerSample = (ma_uint16)pmVar3->bitsPerSample;
  pWav->translatedFormatTag = (ma_uint16)pmVar3->format;
  pWav->dataChunkDataPos = mVar14;
  return 1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_write__internal(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount)
{
    size_t runningPos = 0;
    ma_uint64 initialDataChunkSize = 0;
    ma_uint64 chunkSizeFMT;
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;
        if (pFormat->container == ma_dr_wav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return MA_FALSE;
            }
        }
    }
    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeRIFF = 28 + (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "RIFF", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_RIFF, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_WAVE, 16);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "RF64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else {
        return MA_FALSE;
    }
    if (pFormat->container == ma_dr_wav_container_rf64) {
        ma_uint32 initialds64ChunkSize = 28;
        ma_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "ds64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, initialds64ChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialRiffChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialDataChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, totalSampleCount);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0);
    }
    if (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += ma_dr_wav__write(pWav, "fmt ", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, (ma_uint32)chunkSizeFMT);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_FMT, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);
    if (!pWav->isSequentialWrite && pWav->pMetadata != NULL && pWav->metadataCount > 0 && (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64)) {
        runningPos += ma_dr_wav__write_or_count_metadata(pWav, pWav->pMetadata, pWav->metadataCount);
    }
    pWav->dataChunkDataPos = runningPos;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeDATA = (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeDATA = 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_DATA, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
    }
    pWav->container = pFormat->container;
    pWav->channels = (ma_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (ma_uint16)pFormat->format;
    pWav->dataChunkDataPos = runningPos;
    return MA_TRUE;
}